

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall
DataStream::Xor(DataStream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *key)

{
  long lVar1;
  size_t in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar2;
  Span<const_std::byte> in_stack_00000010;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar2 = MakeWritableByteSpan<DataStream&>(in_stack_ffffffffffffffd8);
  MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)SVar2.m_data);
  SVar2.m_size = (size_t)this;
  SVar2.m_data = (byte *)key;
  util::Xor(SVar2,in_stack_00000010,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Xor(const std::vector<unsigned char>& key)
    {
        util::Xor(MakeWritableByteSpan(*this), MakeByteSpan(key));
    }